

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool __thiscall
Fossilize::StateRecorder::Impl::remap_graphics_pipeline_ci
          (Impl *this,VkGraphicsPipelineCreateInfo *info)

{
  bool bVar1;
  long lVar2;
  uint32_t i;
  ulong uVar3;
  VkBaseInStructure *base_in;
  VkGraphicsPipelineCreateInfo *pVVar4;
  
  bVar1 = remap_render_pass_handle(this,info->renderPass,&info->renderPass);
  if ((bVar1) &&
     (bVar1 = remap_pipeline_layout_handle(this,info->layout,&info->layout), pVVar4 = info, bVar1))
  {
    do {
      pVVar4 = (VkGraphicsPipelineCreateInfo *)pVVar4->pNext;
      if (pVVar4 == (VkGraphicsPipelineCreateInfo *)0x0) goto LAB_00124016;
    } while (pVVar4->sType != VK_STRUCTURE_TYPE_PIPELINE_LIBRARY_CREATE_INFO_KHR);
    lVar2 = 0;
    uVar3 = 0;
    do {
      if (pVVar4->flags <= uVar3) {
LAB_00124016:
        if ((info->basePipelineHandle != (VkPipeline)0x0) &&
           (bVar1 = remap_graphics_pipeline_handle
                              (this,info->basePipelineHandle,&info->basePipelineHandle), !bVar1)) {
          return false;
        }
        bVar1 = remap_shader_module_handles<VkGraphicsPipelineCreateInfo>(this,info);
        return bVar1;
      }
      bVar1 = remap_graphics_pipeline_handle
                        (this,*(VkPipeline *)((long)&pVVar4->pStages->sType + lVar2),
                         (VkPipeline *)((long)&pVVar4->pStages->sType + lVar2));
      uVar3 = uVar3 + 1;
      lVar2 = lVar2 + 8;
    } while (bVar1);
  }
  return false;
}

Assistant:

bool StateRecorder::Impl::remap_graphics_pipeline_ci(VkGraphicsPipelineCreateInfo *info)
{
	if (!remap_render_pass_handle(info->renderPass, &info->renderPass))
		return false;
	if (!remap_pipeline_layout_handle(info->layout, &info->layout))
		return false;

	auto *library = find_pnext<VkPipelineLibraryCreateInfoKHR>(
			VK_STRUCTURE_TYPE_PIPELINE_LIBRARY_CREATE_INFO_KHR, info->pNext);

	if (library)
	{
		for (uint32_t i = 0; i < library->libraryCount; i++)
			if (!remap_graphics_pipeline_handle(library->pLibraries[i], const_cast<VkPipeline *>(&library->pLibraries[i])))
				return false;
	}

	if (info->basePipelineHandle != VK_NULL_HANDLE)
		if (!remap_graphics_pipeline_handle(info->basePipelineHandle, &info->basePipelineHandle))
			return false;

	if (!remap_shader_module_handles(info))
		return false;

	return true;
}